

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

string_t duckdb::StringValueScanner::RemoveEscape
                   (char *str_ptr,idx_t end,char escape,char quote,bool strict_mode,Vector *vector)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  idx_t iVar5;
  idx_t iVar6;
  undefined7 in_register_00000011;
  undefined4 *puVar7;
  Vector *vector_00;
  char *pcVar8;
  bool bVar9;
  string_t removed_escapes;
  undefined1 local_38 [16];
  
  iVar6 = CONCAT71(in_register_00000011,escape);
  if (end == 0) {
    vector_00 = (Vector *)0x0;
  }
  else {
    vector_00 = (Vector *)0x0;
    iVar6 = 0;
    iVar5 = 0;
    pcVar8 = str_ptr;
    do {
      if ((str_ptr[iVar5] != escape) ||
         (pcVar8 = (char *)CONCAT71((int7)((ulong)pcVar8 >> 8),1), (iVar6 & 1) != 0)) {
        if (str_ptr[iVar5] == quote) {
          vector_00 = (Vector *)(&vector_00->vector_type + (byte)((byte)iVar6 | !strict_mode));
        }
        else {
          vector_00 = (Vector *)&vector_00->field_0x1;
        }
        pcVar8 = (char *)0x0;
      }
      iVar5 = iVar5 + 1;
      iVar6 = (ulong)pcVar8 & 0xffffffff;
    } while (end != iVar5);
  }
  local_38 = (undefined1  [16])StringVector::EmptyString((StringVector *)vector,vector_00,iVar6);
  puVar7 = (undefined4 *)local_38._8_8_;
  if ((uint)local_38._0_4_ < 0xd) {
    puVar7 = (undefined4 *)(local_38 + 4);
  }
  if (end != 0) {
    lVar3 = 0;
    iVar6 = 0;
    bVar9 = false;
    do {
      cVar1 = str_ptr[iVar6];
      if ((cVar1 != escape) || (bVar2 = true, bVar9)) {
        if ((bVar9 || !strict_mode) || cVar1 != quote) {
          *(char *)((long)puVar7 + lVar3) = cVar1;
          lVar3 = lVar3 + 1;
        }
        bVar2 = false;
      }
      bVar9 = bVar2;
      iVar6 = iVar6 + 1;
    } while (end != iVar6);
  }
  uVar4 = (ulong)(uint)local_38._0_4_;
  if (uVar4 < 0xd) {
    switchD_01306cb1::default((void *)((long)(local_38 + 4) + uVar4),0,0xc - uVar4);
  }
  else {
    local_38._4_4_ = *(undefined4 *)local_38._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_38;
}

Assistant:

string_t StringValueScanner::RemoveEscape(const char *str_ptr, idx_t end, char escape, char quote, bool strict_mode,
                                          Vector &vector) {
	// Figure out the exact size
	idx_t str_pos = 0;
	bool just_escaped = false;
	for (idx_t cur_pos = 0; cur_pos < end; cur_pos++) {
		if (str_ptr[cur_pos] == escape && !just_escaped) {
			just_escaped = true;
		} else if (str_ptr[cur_pos] == quote) {
			if (just_escaped || !strict_mode) {
				str_pos++;
			}
			just_escaped = false;
		} else {
			just_escaped = false;
			str_pos++;
		}
	}

	auto removed_escapes = StringVector::EmptyString(vector, str_pos);
	auto removed_escapes_ptr = removed_escapes.GetDataWriteable();
	// Allocate string and copy it
	str_pos = 0;
	just_escaped = false;
	for (idx_t cur_pos = 0; cur_pos < end; cur_pos++) {
		const char c = str_ptr[cur_pos];
		if (c == escape && !just_escaped) {
			just_escaped = true;
		} else if (str_ptr[cur_pos] == quote) {
			if (just_escaped || !strict_mode) {
				removed_escapes_ptr[str_pos++] = c;
			}
			just_escaped = false;
		} else {
			just_escaped = false;
			removed_escapes_ptr[str_pos++] = c;
		}
	}
	removed_escapes.Finalize();
	return removed_escapes;
}